

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Convolution3DLayerParams::InternalSwap
          (Convolution3DLayerParams *this,Convolution3DLayerParams *other)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  WeightParams *pWVar4;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  pWVar4 = this->weights_;
  this->weights_ = other->weights_;
  other->weights_ = pWVar4;
  pWVar4 = this->bias_;
  this->bias_ = other->bias_;
  other->bias_ = pWVar4;
  iVar2 = this->outputchannels_;
  this->outputchannels_ = other->outputchannels_;
  other->outputchannels_ = iVar2;
  iVar2 = this->inputchannels_;
  this->inputchannels_ = other->inputchannels_;
  other->inputchannels_ = iVar2;
  iVar2 = this->ngroups_;
  this->ngroups_ = other->ngroups_;
  other->ngroups_ = iVar2;
  iVar2 = this->kerneldepth_;
  this->kerneldepth_ = other->kerneldepth_;
  other->kerneldepth_ = iVar2;
  iVar2 = this->kernelheight_;
  this->kernelheight_ = other->kernelheight_;
  other->kernelheight_ = iVar2;
  iVar2 = this->kernelwidth_;
  this->kernelwidth_ = other->kernelwidth_;
  other->kernelwidth_ = iVar2;
  iVar2 = this->stridedepth_;
  this->stridedepth_ = other->stridedepth_;
  other->stridedepth_ = iVar2;
  iVar2 = this->strideheight_;
  this->strideheight_ = other->strideheight_;
  other->strideheight_ = iVar2;
  iVar2 = this->stridewidth_;
  this->stridewidth_ = other->stridewidth_;
  other->stridewidth_ = iVar2;
  iVar2 = this->dilationdepth_;
  this->dilationdepth_ = other->dilationdepth_;
  other->dilationdepth_ = iVar2;
  iVar2 = this->dilationheight_;
  this->dilationheight_ = other->dilationheight_;
  other->dilationheight_ = iVar2;
  iVar2 = this->dilationwidth_;
  this->dilationwidth_ = other->dilationwidth_;
  other->dilationwidth_ = iVar2;
  bVar1 = this->hasbias_;
  this->hasbias_ = other->hasbias_;
  other->hasbias_ = bVar1;
  bVar1 = this->isdeconvolution_;
  this->isdeconvolution_ = other->isdeconvolution_;
  other->isdeconvolution_ = bVar1;
  iVar3 = this->paddingtype_;
  this->paddingtype_ = other->paddingtype_;
  other->paddingtype_ = iVar3;
  iVar2 = this->custompaddingfront_;
  this->custompaddingfront_ = other->custompaddingfront_;
  other->custompaddingfront_ = iVar2;
  iVar2 = this->custompaddingback_;
  this->custompaddingback_ = other->custompaddingback_;
  other->custompaddingback_ = iVar2;
  iVar2 = this->custompaddingtop_;
  this->custompaddingtop_ = other->custompaddingtop_;
  other->custompaddingtop_ = iVar2;
  iVar2 = this->custompaddingbottom_;
  this->custompaddingbottom_ = other->custompaddingbottom_;
  other->custompaddingbottom_ = iVar2;
  iVar2 = this->custompaddingleft_;
  this->custompaddingleft_ = other->custompaddingleft_;
  other->custompaddingleft_ = iVar2;
  iVar2 = this->custompaddingright_;
  this->custompaddingright_ = other->custompaddingright_;
  other->custompaddingright_ = iVar2;
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void Convolution3DLayerParams::InternalSwap(Convolution3DLayerParams* other) {
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(weights_, other->weights_);
  std::swap(bias_, other->bias_);
  std::swap(outputchannels_, other->outputchannels_);
  std::swap(inputchannels_, other->inputchannels_);
  std::swap(ngroups_, other->ngroups_);
  std::swap(kerneldepth_, other->kerneldepth_);
  std::swap(kernelheight_, other->kernelheight_);
  std::swap(kernelwidth_, other->kernelwidth_);
  std::swap(stridedepth_, other->stridedepth_);
  std::swap(strideheight_, other->strideheight_);
  std::swap(stridewidth_, other->stridewidth_);
  std::swap(dilationdepth_, other->dilationdepth_);
  std::swap(dilationheight_, other->dilationheight_);
  std::swap(dilationwidth_, other->dilationwidth_);
  std::swap(hasbias_, other->hasbias_);
  std::swap(isdeconvolution_, other->isdeconvolution_);
  std::swap(paddingtype_, other->paddingtype_);
  std::swap(custompaddingfront_, other->custompaddingfront_);
  std::swap(custompaddingback_, other->custompaddingback_);
  std::swap(custompaddingtop_, other->custompaddingtop_);
  std::swap(custompaddingbottom_, other->custompaddingbottom_);
  std::swap(custompaddingleft_, other->custompaddingleft_);
  std::swap(custompaddingright_, other->custompaddingright_);
  std::swap(_cached_size_, other->_cached_size_);
}